

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

GridHandle<pbrt::NanoVDBBuffer> *
nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
          (GridHandle<pbrt::NanoVDBBuffer> *__return_storage_ptr__,string *fileName,string *gridName
          ,int verbose,NanoVDBBuffer *buffer)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  long *plVar4;
  runtime_error *this;
  long *plVar5;
  ifstream is;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  istream local_230 [520];
  
  std::ifstream::ifstream(local_230,(string *)fileName,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    readGrid<pbrt::NanoVDBBuffer>(__return_storage_ptr__,local_230,gridName,buffer);
    if (verbose != 0) {
      iVar2 = (*(__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase[2])
                        (__return_storage_ptr__);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"File named \"",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(fileName->_M_dataplus)._M_p,
                            fileName->_M_string_length);
        std::operator+(&local_250,"\" does not contain a grid named \"",gridName);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_260 = *plVar5;
          lStack_258 = plVar4[3];
          local_270 = &local_260;
        }
        else {
          local_260 = *plVar5;
          local_270 = (long *)*plVar4;
        }
        local_268 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_270,local_268);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Read NanoGrid named \"",0x15);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(gridName->_M_dataplus)._M_p,
                            gridName->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" from the file named \"",0x17);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
    }
    std::ifstream::~ifstream(local_230);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,"Unable to open file named \"",fileName);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
  plVar5 = plVar4 + 2;
  local_270 = (long *)*plVar4;
  if (local_270 == plVar5) {
    local_260 = *plVar5;
    lStack_258 = plVar4[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar5;
  }
  local_268 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_270);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GridHandle<BufferT> readGrid(const std::string& fileName, const std::string& gridName, int verbose, const BufferT& buffer)
{
    std::ifstream is(fileName, std::ios::in | std::ios::binary);
    if (!is.is_open())
        throw std::runtime_error("Unable to open file named \"" + fileName + "\" for input");
    auto handle = readGrid<BufferT>(is, gridName, buffer);
    if (verbose) {
        if (handle) {
            std::cout << "Read NanoGrid named \"" << gridName << "\" from the file named \"" << fileName << "\"" << std::endl;
        } else {
            std::cout << "File named \"" << fileName << "\" does not contain a grid named \"" + gridName + "\"" << std::endl;
        }
    }
    return handle;// is converted to r-value and return value is move constructed.
}